

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::BitCountCase::compare(BitCountCase *this,void **inputs,void **outputs)

{
  char cVar1;
  uint a;
  int iVar2;
  pointer pSVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  
  pSVar3 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar1 = (&DAT_018a3da0)[(ulong)(pSVar3->varType).m_data.basic.precision * 4];
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  uVar9 = 0;
  uVar8 = 0;
  if (0 < (int)uVar4) {
    uVar8 = (ulong)uVar4;
  }
  do {
    if (uVar8 == uVar9) {
LAB_012770b3:
      return (long)(int)uVar4 <= (long)uVar9;
    }
    a = *(uint *)((long)*inputs + uVar9 * 4);
    iVar2 = *(int *)((long)*outputs + uVar9 * 4);
    iVar5 = dePop32(a & (2 << (cVar1 - 1U & 0x1f)) - 1U);
    iVar6 = dePop32(a);
    if ((iVar2 < iVar5) || (iVar6 < iVar2)) {
      poVar7 = std::operator<<(&(this->super_IntegerFunctionCase).m_failMsg.
                                super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar9);
      poVar7 = std::operator<<(poVar7,"] in range [");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
      poVar7 = std::operator<<(poVar7,", ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
      std::operator<<(poVar7,"]");
      goto LAB_012770b3;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const deUint32			countMask		= getLowBitMask(integerLength);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const int		out		= ((const int*)outputs[0])[compNdx];
			const int		minRef	= dePop32(value&countMask);
			const int		maxRef	= dePop32(value);

			if (!de::inRange(out, minRef, maxRef))
			{
				m_failMsg << "Expected [" << compNdx << "] in range [" << minRef << ", " << maxRef << "]";
				return false;
			}
		}

		return true;
	}